

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::HandleTestModelArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  const_reference this_00;
  size_type sVar4;
  ostream *poVar5;
  char *pcVar6;
  char *in_R8;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view varg1;
  string local_490 [32];
  ostringstream local_470 [8];
  ostringstream cmCTestLog_msg_1;
  string local_2f8 [32];
  ostringstream local_2d8 [8];
  ostringstream cmCTestLog_msg;
  string local_140;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  string local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  string local_90;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_70;
  const_reference local_60;
  string *str;
  char *local_50;
  string *local_48;
  char *local_40;
  const_reference local_38;
  string *arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  bool success;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  char *ctestExec_local;
  cmCTest *this_local;
  
  arg._7_1_ = 1;
  pvStack_28 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)i;
  i_local = (size_t *)ctestExec;
  ctestExec_local = (char *)this;
  this_00 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,*i);
  local_38 = this_00;
  _str = (string_view)::cm::operator____s("-M",2);
  local_48 = str;
  local_40 = local_50;
  varg1._M_str = "--test-model";
  varg1._M_len = (size_t)local_50;
  bVar2 = CheckArgument((cmCTest *)this_00,str,varg1,in_R8);
  bVar3 = false;
  if (bVar2) {
    pbVar1 = (args_local->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvStack_28);
    bVar3 = pbVar1 < (pointer)(sVar4 - 1);
  }
  if (bVar3) {
    (args_local->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         (pointer)&((args_local->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->field_0x1;
    local_60 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_28,
                            (size_type)
                            (args_local->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
    cmsys::SystemTools::LowerCase(&local_90,local_60);
    local_70 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
    local_b0 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("nightly",7);
    local_a0 = local_b0;
    bVar3 = std::operator==(local_70,local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar3) {
      SetTestModel(this,1);
    }
    else {
      cmsys::SystemTools::LowerCase(&local_f0,local_60);
      local_d0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f0);
      local_110 = (basic_string_view<char,_std::char_traits<char>_>)
                  ::cm::operator____s("continuous",10);
      local_100 = local_110;
      bVar3 = std::operator==(local_d0,local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      if (bVar3) {
        SetTestModel(this,2);
      }
      else {
        cmsys::SystemTools::LowerCase(&local_140,local_60);
        local_120 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_140);
        __y = (basic_string_view<char,_std::char_traits<char>_>)
              ::cm::operator____s("experimental",0xc);
        bVar3 = std::operator==(local_120,__y);
        std::__cxx11::string::~string((string *)&local_140);
        if (bVar3) {
          SetTestModel(this,0);
        }
        else {
          arg._7_1_ = 0;
          std::__cxx11::ostringstream::ostringstream(local_2d8);
          poVar5 = std::operator<<((ostream *)local_2d8,"CTest -M called with incorrect option: ");
          poVar5 = std::operator<<(poVar5,(string *)local_60);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          Log(this,7,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0xb25,pcVar6,false);
          std::__cxx11::string::~string(local_2f8);
          std::__cxx11::ostringstream::~ostringstream(local_2d8);
          std::__cxx11::ostringstream::ostringstream(local_470);
          poVar5 = std::operator<<((ostream *)local_470,"Available options are:");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = std::operator<<(poVar5,(char *)i_local);
          poVar5 = std::operator<<(poVar5," -M Continuous");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = std::operator<<(poVar5,(char *)i_local);
          poVar5 = std::operator<<(poVar5," -M Experimental");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = std::operator<<(poVar5,(char *)i_local);
          poVar5 = std::operator<<(poVar5," -M Nightly");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          Log(this,7,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0xb2b,pcVar6,false);
          std::__cxx11::string::~string(local_490);
          std::__cxx11::ostringstream::~ostringstream(local_470);
        }
      }
    }
  }
  return (bool)(arg._7_1_ & 1);
}

Assistant:

bool cmCTest::HandleTestModelArgument(const char* ctestExec, size_t& i,
                                      const std::vector<std::string>& args)
{
  bool success = true;
  std::string const& arg = args[i];
  if (this->CheckArgument(arg, "-M"_s, "--test-model") &&
      (i < args.size() - 1)) {
    i++;
    std::string const& str = args[i];
    if (cmSystemTools::LowerCase(str) == "nightly"_s) {
      this->SetTestModel(cmCTest::NIGHTLY);
    } else if (cmSystemTools::LowerCase(str) == "continuous"_s) {
      this->SetTestModel(cmCTest::CONTINUOUS);
    } else if (cmSystemTools::LowerCase(str) == "experimental"_s) {
      this->SetTestModel(cmCTest::EXPERIMENTAL);
    } else {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE,
                 "CTest -M called with incorrect option: " << str
                                                           << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -M Continuous" << std::endl
                   << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
    }
  }
  return success;
}